

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<float>::btAlignedObjectArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  size_t size;
  int iVar1;
  int iVar2;
  float *pfVar3;
  float *__s;
  long lVar4;
  long lVar5;
  
  this->m_ownsMemory = true;
  this->m_data = (float *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  iVar1 = otherArray->m_size;
  lVar5 = (long)iVar1;
  if (lVar5 < 1) {
    this->m_size = iVar1;
    return;
  }
  size = lVar5 * 4;
  __s = (float *)btAlignedAllocInternal(size,0x10);
  iVar2 = this->m_size;
  pfVar3 = this->m_data;
  if ((long)iVar2 < 1) {
    if (pfVar3 == (float *)0x0) {
      this->m_ownsMemory = true;
      this->m_data = __s;
      this->m_capacity = iVar1;
      memset(__s,0,size);
      this->m_size = iVar1;
      goto LAB_001d0c1e;
    }
  }
  else {
    lVar4 = 0;
    do {
      __s[lVar4] = pfVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (this->m_ownsMemory == true) {
    btAlignedFreeInternal(pfVar3);
  }
  this->m_ownsMemory = true;
  this->m_data = __s;
  this->m_capacity = iVar1;
  memset(__s,0,size);
  this->m_size = iVar1;
  if (iVar1 < 1) {
    return;
  }
LAB_001d0c1e:
  pfVar3 = otherArray->m_data;
  lVar4 = 0;
  do {
    __s[lVar4] = pfVar3[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar5 != lVar4);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}